

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

void timerepr_to_string(TimeRepr *repr,char *string,size_t n)

{
  int iVar1;
  size_t __maxlen;
  char *__s;
  
  __maxlen = n;
  __s = string;
  if (0 < repr->days) {
    iVar1 = snprintf(string,n,"%d day(s), ");
    __s = string + iVar1;
    __maxlen = n - (long)iVar1;
  }
  if (0 < repr->hours) {
    iVar1 = snprintf(__s,__maxlen,"%d hours(s), ");
    __s = __s + iVar1;
    __maxlen = __maxlen - (long)iVar1;
  }
  if (0 < repr->minutes) {
    iVar1 = snprintf(__s,__maxlen,"%d minutes(s), ");
    __s = __s + iVar1;
    __maxlen = __maxlen - (long)iVar1;
  }
  if (0 < repr->seconds) {
    iVar1 = snprintf(__s,__maxlen,"%d seconds(s), ");
    __s = __s + iVar1;
    __maxlen = __maxlen - (long)iVar1;
  }
  if (0 < repr->milliseconds) {
    iVar1 = snprintf(__s,__maxlen,"%d msec(s), ");
    __s = __s + iVar1;
    __maxlen = __maxlen - (long)iVar1;
  }
  if (0 < repr->microseconds) {
    snprintf(__s,__maxlen,"%d usec(s)");
  }
  string[n - 1] = '\0';
  return;
}

Assistant:

void timerepr_to_string(const TimeRepr *repr, char *string, size_t n) {
    char *s = string;
    size_t rem = n;
    if (repr->days > 0) {
        int amt = snprintf(s, rem, "%d day(s), ", repr->days);
        s += amt;
        rem -= amt;
    }

    if (repr->hours > 0) {
        int amt = snprintf(s, rem, "%d hours(s), ", repr->hours);
        s += amt;
        rem -= amt;
    }

    if (repr->minutes > 0) {
        int amt = snprintf(s, rem, "%d minutes(s), ", repr->minutes);
        s += amt;
        rem -= amt;
    }

    if (repr->seconds > 0) {
        int amt = snprintf(s, rem, "%d seconds(s), ", repr->seconds);
        s += amt;
        rem -= amt;
    }

    if (repr->milliseconds > 0) {
        int amt = snprintf(s, rem, "%d msec(s), ", repr->milliseconds);
        s += amt;
        rem -= amt;
    }

    if (repr->microseconds > 0) {
        int amt = snprintf(s, rem, "%d usec(s)", repr->microseconds);
        s += amt;
        rem -= amt;
    }
    string[n - 1] = 0;
}